

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<void_(char_*,_unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_(char_*,_unsigned_long)>::With
          (FunctionMocker<void_(char_*,_unsigned_long)> *this,Matcher<char_*> *m1,
          Matcher<unsigned_long> *m2)

{
  MockSpec<void_(char_*,_unsigned_long)> *pMVar1;
  FunctionMockerBase<void_(char_*,_unsigned_long)> *in_RDI;
  ArgumentMatcherTuple *in_stack_ffffffffffffff88;
  
  pMVar1 = FunctionMockerBase<void_(char_*,_unsigned_long)>::current_spec(in_RDI);
  std::tr1::make_tuple<testing::Matcher<char*>,testing::Matcher<unsigned_long>>
            ((Matcher<char_*> *)pMVar1,(Matcher<unsigned_long> *)in_RDI);
  MockSpec<void_(char_*,_unsigned_long)>::SetMatchers
            ((MockSpec<void_(char_*,_unsigned_long)> *)in_RDI,in_stack_ffffffffffffff88);
  std::tr1::
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  ::~tuple((tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
            *)in_RDI);
  pMVar1 = FunctionMockerBase<void_(char_*,_unsigned_long)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2));
    return this->current_spec();
  }